

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,1ul>
::operator()(dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,1ul>
             *this,dynamic_dims_array d0,undefined8 d1)

{
  size_t sVar1;
  static_sentinel<1UL> local_29;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,1ul>
  *local_28;
  dims_ternary_reduction<std::experimental::detail::span_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_1UL,_1UL>
  *this_local;
  undefined8 local_18;
  dimensions<18446744073709551615UL> d1_local;
  dimensions<18446744073709551615UL> d0_local;
  
  local_28 = this;
  local_18 = d1;
  d1_local.dynamic_dims_._M_elems[0] = (dynamic_dims_array)(dynamic_dims_array)d0._M_elems[0];
  sVar1 = static_sentinel<1UL>::operator()(&local_29);
  return sVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
      , dimensions<Dims1...> d1
      , dimensions<Dims2...> d2
        ) const noexcept
    {
        static_assert(
               dimensions<Dims0...>::rank() == dimensions<Dims1...>::rank()
            && dimensions<Dims0...>::rank() == dimensions<Dims2...>::rank()
          , "Arguments to ternary reduction have unequal rank"
        );
        static_assert(
               dimensions<Dims0...>::rank() == Size 
            || dimensions<Dims1...>::rank() == Size 
            || dimensions<Dims2...>::rank() == Size 
          , "Size not equal to rank of arguments"
        );

        return Sentinel()();
    }